

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextCountUtf8BytesFromStr(ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  ImWchar *pIVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = 0;
  if (in_text_end == (ImWchar *)0x0 || in_text < in_text_end) {
    pIVar3 = in_text + 1;
    iVar2 = 0;
    do {
      uVar1 = pIVar3[-1];
      if (uVar1 == 0) {
        return iVar2;
      }
      iVar4 = 3 - (uint)(uVar1 < 0x800);
      if (uVar1 < 0x80) {
        iVar4 = 1;
      }
      iVar2 = iVar2 + iVar4;
      bVar5 = pIVar3 < in_text_end;
      pIVar3 = pIVar3 + 1;
    } while (bVar5 || in_text_end == (ImWchar *)0x0);
  }
  return iVar2;
}

Assistant:

int ImTextCountUtf8BytesFromStr(const ImWchar* in_text, const ImWchar* in_text_end)
{
    int bytes_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            bytes_count++;
        else
            bytes_count += ImTextCountUtf8BytesFromChar(c);
    }
    return bytes_count;
}